

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_id_list_around(REF_CELL ref_cell,REF_INT node,REF_INT max_ids,REF_INT *n_ids,REF_INT *ids)

{
  bool bVar1;
  uint uVar2;
  REF_INT local_cc;
  REF_INT local_c8;
  int local_c4;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL already_have_it;
  REF_INT nodes [27];
  int local_40;
  REF_INT deg;
  REF_INT id;
  REF_INT cell;
  REF_INT item;
  REF_INT *ids_local;
  REF_INT *n_ids_local;
  REF_INT max_ids_local;
  REF_INT node_local;
  REF_CELL ref_cell_local;
  
  *n_ids = 0;
  if ((node < 0) || (ref_cell->ref_adj->nnode <= node)) {
    local_c4 = -1;
  }
  else {
    local_c4 = ref_cell->ref_adj->first[node];
  }
  id = local_c4;
  if (local_c4 == -1) {
    local_c8 = -1;
  }
  else {
    local_c8 = ref_cell->ref_adj->item[local_c4].ref;
  }
  deg = local_c8;
  while( true ) {
    if (id == -1) {
      return 0;
    }
    uVar2 = ref_cell_nodes(ref_cell,deg,&ref_private_macro_code_rss);
    if (uVar2 != 0) break;
    bVar1 = false;
    for (local_40 = 0; local_40 < *n_ids; local_40 = local_40 + 1) {
      if ((&ref_private_macro_code_rss)[ref_cell->node_per] == ids[local_40]) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      if (max_ids <= *n_ids) {
        return 7;
      }
      ids[*n_ids] = (&ref_private_macro_code_rss)[ref_cell->node_per];
      *n_ids = *n_ids + 1;
    }
    id = ref_cell->ref_adj->item[id].next;
    if (id == -1) {
      local_cc = -1;
    }
    else {
      local_cc = ref_cell->ref_adj->item[id].ref;
    }
    deg = local_cc;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x4fc,
         "ref_cell_id_list_around",(ulong)uVar2,"nodes");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around(REF_CELL ref_cell, REF_INT node,
                                           REF_INT max_ids, REF_INT *n_ids,
                                           REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;

  *n_ids = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}